

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorSpeed::IntStateGather
          (ChShaftsMotorSpeed *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  Scalar SVar1;
  Scalar *pSVar2;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x,(ulong)off_x);
  *pSVar2 = 0.0;
  SVar1 = this->aux_dt;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)v,(ulong)off_v);
  *pSVar2 = SVar1;
  *T = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.ChTime;
  return;
}

Assistant:

void ChShaftsMotorSpeed::IntStateGather(const unsigned int off_x,  // offset in x state vector
                             ChState& x,                // state vector, position part
                             const unsigned int off_v,  // offset in v state vector
                             ChStateDelta& v,           // state vector, speed part
                             double& T                  // time
                             ) {
    x(off_x) = 0;//aux;
    v(off_v) = aux_dt;
    T = GetChTime();
}